

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  stbi__uint32 sVar4;
  bool bVar5;
  undefined8 uVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  stbi__uint32 sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  stbi__uint16 *psVar20;
  float *data;
  stbi_uc *psVar21;
  void *pvVar22;
  stbi_uc *psVar23;
  stbi_uc *psVar24;
  stbi_uc (*pal_00) [4];
  byte *pbVar25;
  stbi__context *psVar26;
  stbi_uc *psVar27;
  byte bVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  char *pcVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  size_t __size;
  uint uVar39;
  uint uVar40;
  undefined4 in_register_00000084;
  int *piVar41;
  int *piVar42;
  stbi__result_info *ri_00;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  void *pvVar46;
  int iVar47;
  uint uVar48;
  stbi__uint16 *psVar49;
  long *in_FS_OFFSET;
  bool bVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  stbi_uc pal [256] [4];
  uint local_8990;
  void *local_8978;
  stbi__context *local_8968;
  stbi__bmp_data local_88d4;
  long local_88b0;
  stbi__gif local_88a8;
  
  piVar41 = (int *)CONCAT44(in_register_00000084,req_comp);
  piVar41[2] = 0;
  piVar41[0] = 8;
  piVar41[1] = 0;
  piVar42 = piVar41;
  ri_00 = ri;
  iVar10 = stbi__check_png_header(s);
  uVar40 = (uint)piVar42;
  psVar21 = s->img_buffer_original;
  s->img_buffer = psVar21;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar10 != 0) {
    local_88a8._0_8_ = s;
    iVar10 = stbi__parse_png_file((stbi__png *)&local_88a8,0,4);
    psVar20 = (stbi__uint16 *)local_88a8.history;
    uVar6 = local_88a8._0_8_;
    psVar49 = (stbi__uint16 *)0x0;
    if (iVar10 == 0) {
LAB_00457093:
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar49;
    }
    iVar10 = 8;
    if ((local_88a8.flags < 9) || (iVar10 = 0x10, local_88a8.flags == 0x10)) {
      *piVar41 = iVar10;
      local_88a8.history = (stbi_uc *)0x0;
      iVar10 = *(int *)(local_88a8._0_8_ + 0xc);
      if (iVar10 != 4) {
        if (local_88a8.flags < 9) {
          psVar20 = (stbi__uint16 *)
                    stbi__convert_format
                              ((uchar *)psVar20,iVar10,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4),uVar40);
        }
        else {
          psVar20 = stbi__convert_format16
                              (psVar20,iVar10,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4),uVar40);
        }
        *(int *)(uVar6 + 0xc) = 4;
        if (psVar20 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)uVar6;
      *y = *(stbi__uint32 *)(uVar6 + 4);
      psVar49 = psVar20;
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar6 + 8);
      }
      goto LAB_00457093;
    }
    lVar35 = *in_FS_OFFSET;
    pcVar32 = "bad bits_per_channel";
    goto LAB_00457ebc;
  }
  pcVar32 = (char *)x;
  if (psVar21 < s->img_buffer_original_end) {
LAB_004570ff:
    s->img_buffer = psVar21 + 1;
    bVar51 = true;
    if (*psVar21 == 'B') {
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_00457216;
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      if (*psVar21 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar11 = stbi__get16le(s);
        pcVar32 = (char *)(ulong)uVar11;
        iVar10 = stbi__get16le(s);
        uVar11 = iVar10 << 0x10 | uVar11;
        if ((((0x38 < uVar11) ||
             (bVar51 = false, (0x100010000001000U >> ((ulong)uVar11 & 0x3f) & 1) == 0)) &&
            (bVar51 = false, uVar11 != 0x6c)) && (uVar11 != 0x7c)) goto LAB_00457213;
      }
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      pcVar32 = (char *)s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = (stbi_uc *)pcVar32;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = (stbi_uc *)pcVar32;
        s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
      }
      psVar21 = s->img_buffer;
      goto LAB_004570ff;
    }
LAB_00457213:
    bVar51 = true;
  }
LAB_00457216:
  psVar21 = s->img_buffer_original;
  s->img_buffer = psVar21;
  s->img_buffer_end = s->img_buffer_original_end;
  if (bVar51) {
    if (psVar21 < s->img_buffer_original_end) {
LAB_0045735f:
      s->img_buffer = psVar21 + 1;
      if (*psVar21 != 'G') goto LAB_00457cae;
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_00457cae;
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      if (*psVar21 != 'I') goto LAB_00457cae;
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_00457cae;
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      if (*psVar21 != 'F') goto LAB_00457cae;
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_00457cae;
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      if (*psVar21 != '8') goto LAB_00457cae;
      psVar21 = s->img_buffer;
      if (psVar21 < s->img_buffer_end) {
LAB_00457c32:
        s->img_buffer = psVar21 + 1;
        sVar7 = *psVar21;
      }
      else {
        if (s->read_from_callbacks != 0) {
          pcVar32 = (char *)s->buffer_start;
          iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
          s->callback_already_read =
               s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original)
          ;
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = (stbi_uc *)pcVar32;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = (stbi_uc *)pcVar32;
            s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
          }
          psVar21 = s->img_buffer;
          goto LAB_00457c32;
        }
        sVar7 = '\0';
      }
      if ((sVar7 != '9') && (sVar7 != '7')) goto LAB_00457cae;
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_00457cae;
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      sVar7 = *psVar21;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (sVar7 == 'a') {
        memset(&local_88a8,0,0x8870);
        psVar21 = local_88a8.out;
        if ((stbi__context *)local_88a8.out == (stbi__context *)0x0) {
          pcVar32 = (char *)0x0;
          iVar10 = stbi__gif_header(s,&local_88a8,comp,0);
          if (iVar10 == 0) goto LAB_00459924;
          iVar10 = local_88a8.w;
          iVar15 = local_88a8.h;
          iVar16 = stbi__mad3sizes_valid(4,local_88a8.w,local_88a8.h,0);
          if (iVar16 == 0) {
            pcVar32 = "too large";
          }
          else {
            iVar15 = iVar15 * iVar10;
            __size = (size_t)(iVar15 * 4);
            psVar26 = (stbi__context *)malloc(__size);
            local_88a8.out = (stbi_uc *)psVar26;
            psVar27 = (stbi_uc *)malloc(__size);
            local_88a8.background = psVar27;
            psVar20 = (stbi__uint16 *)malloc((long)iVar15);
            pcVar32 = "outofmem";
            local_88a8.history = (stbi_uc *)psVar20;
            if ((psVar26 != (stbi__context *)0x0) &&
               (psVar20 != (stbi__uint16 *)0x0 && psVar27 != (stbi_uc *)0x0)) {
              memset(psVar26,0,__size);
              memset(psVar27,0,__size);
              memset(psVar20,0,(long)iVar15);
              goto LAB_00458b0e;
            }
          }
          *(char **)(*in_FS_OFFSET + -8) = pcVar32;
          pcVar32 = (char *)0x0;
        }
        else {
          if (0 < local_88a8.h * local_88a8.w && (local_88a8.eflags & 0x18U) == 8) {
            uVar34 = 0;
            do {
              if (*(char *)((long)local_88a8.history + uVar34) != '\0') {
                *(undefined4 *)((stbi_uc *)((long)local_88a8.out + 0x38) + uVar34 * 4 + -0x38) =
                     *(undefined4 *)(local_88a8.background + uVar34 * 4);
              }
              uVar34 = uVar34 + 1;
            } while ((uint)(local_88a8.h * local_88a8.w) != uVar34);
          }
          memcpy(local_88a8.background,local_88a8.out,(long)local_88a8.h * (long)local_88a8.w * 4);
LAB_00458b0e:
          memset(local_88a8.history,0,(long)local_88a8.h * (long)local_88a8.w);
          psVar27 = s->buffer_start;
          psVar23 = s->buffer_start + 1;
          puVar1 = (undefined8 *)(*in_FS_OFFSET + -8);
          do {
            psVar24 = s->img_buffer;
            if (psVar24 < s->img_buffer_end) {
LAB_00458bcc:
              s->img_buffer = psVar24 + 1;
              sVar7 = *psVar24;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                s->callback_already_read =
                     s->callback_already_read +
                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar27;
                  s->img_buffer_end = psVar23;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar27;
                  s->img_buffer_end = psVar27 + iVar10;
                }
                psVar24 = s->img_buffer;
                goto LAB_00458bcc;
              }
              sVar7 = '\0';
            }
            if (sVar7 == '!') {
              psVar24 = s->img_buffer;
              if (s->img_buffer_end <= psVar24) {
                if (s->read_from_callbacks == 0) goto LAB_00459687;
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                s->callback_already_read =
                     s->callback_already_read +
                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar27;
                  s->img_buffer_end = psVar23;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar27;
                  s->img_buffer_end = psVar27 + iVar10;
                }
                psVar24 = s->img_buffer;
              }
              s->img_buffer = psVar24 + 1;
              if (*psVar24 != 0xf9) goto LAB_00459687;
              pbVar25 = s->img_buffer;
              if (pbVar25 < s->img_buffer_end) {
LAB_00458e35:
                s->img_buffer = pbVar25 + 1;
                bVar8 = *pbVar25;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                  s->callback_already_read =
                       s->callback_already_read +
                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar27;
                    s->img_buffer_end = psVar23;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar27;
                    s->img_buffer_end = psVar27 + iVar10;
                  }
                  pbVar25 = s->img_buffer;
                  goto LAB_00458e35;
                }
                bVar8 = 0;
              }
              if (bVar8 == 4) {
                pbVar25 = s->img_buffer;
                if (pbVar25 < s->img_buffer_end) {
LAB_00459017:
                  s->img_buffer = pbVar25 + 1;
                  local_88a8.eflags = (int)*pbVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar23;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar27 + iVar10;
                    }
                    pbVar25 = s->img_buffer;
                    goto LAB_00459017;
                  }
                  local_88a8.eflags = 0;
                }
                local_88a8.delay = stbi__get16le(s);
                local_88a8.delay = local_88a8.delay * 10;
                if (-1 < (long)local_88a8.transparent) {
                  local_88a8.pal[local_88a8.transparent][3] = 0xff;
                }
                if ((local_88a8.eflags & 1U) != 0) {
                  pbVar25 = s->img_buffer;
                  if (pbVar25 < s->img_buffer_end) {
LAB_0045965b:
                    s->img_buffer = pbVar25 + 1;
                    bVar8 = *pbVar25;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar27;
                        s->img_buffer_end = psVar23;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar27;
                        s->img_buffer_end = psVar27 + iVar10;
                      }
                      pbVar25 = s->img_buffer;
                      goto LAB_0045965b;
                    }
                    bVar8 = 0;
                  }
                  local_88a8.transparent = (int)bVar8;
                  local_88a8.pal[bVar8][3] = '\0';
                  goto LAB_00459687;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0045907c:
                  s->img_buffer = s->img_buffer + 1;
                }
                else {
                  iVar10 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
                  if (0 < iVar10) goto LAB_0045907c;
                  s->img_buffer = s->img_buffer_end;
                  (*(s->io).skip)(s->io_user_data,1 - iVar10);
                }
                local_88a8.transparent = 0xffffffff;
LAB_00459687:
                do {
                  pbVar25 = s->img_buffer;
                  if (pbVar25 < s->img_buffer_end) {
LAB_00459701:
                    s->img_buffer = pbVar25 + 1;
                    bVar8 = *pbVar25;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar27;
                        s->img_buffer_end = psVar23;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar27;
                        s->img_buffer_end = psVar27 + iVar10;
                      }
                      pbVar25 = s->img_buffer;
                      goto LAB_00459701;
                    }
                    bVar8 = 0;
                  }
                  if (bVar8 == 0) goto LAB_00459716;
                  stbi__skip(s,(uint)bVar8);
                } while( true );
              }
              stbi__skip(s,(uint)bVar8);
LAB_00459716:
              bVar51 = true;
            }
            else if (sVar7 == ';') {
              bVar51 = false;
              pcVar32 = (char *)s;
            }
            else if (sVar7 == ',') {
              iVar10 = stbi__get16le(s);
              iVar15 = stbi__get16le(s);
              iVar16 = stbi__get16le(s);
              iVar17 = stbi__get16le(s);
              if (local_88a8.w < iVar16 + iVar10) {
LAB_00458c33:
                *puVar1 = "bad Image Descriptor";
              }
              else {
                if (local_88a8.h < iVar17 + iVar15) goto LAB_00458c33;
                local_88a8.line_size = local_88a8.w * 4;
                local_88a8.start_x = iVar10 << 2;
                local_88a8.start_y = iVar15 * local_88a8.line_size;
                local_88a8.max_x = (iVar16 + iVar10) * 4;
                local_88a8.max_y = local_88a8.line_size * (iVar17 + iVar15);
                local_88a8.cur_y = local_88a8.max_y;
                if (iVar16 != 0) {
                  local_88a8.cur_y = local_88a8.start_y;
                }
                pbVar25 = s->img_buffer;
                local_88a8.cur_x = local_88a8.start_x;
                if (pbVar25 < s->img_buffer_end) {
LAB_00458ee2:
                  s->img_buffer = pbVar25 + 1;
                  local_88a8.lflags = (int)*pbVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar23;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar27 + iVar10;
                    }
                    pbVar25 = s->img_buffer;
                    goto LAB_00458ee2;
                  }
                  local_88a8.lflags = 0;
                }
                local_88a8.step = local_88a8.line_size * 8;
                if ((local_88a8.lflags & 0x40U) == 0) {
                  local_88a8.step = local_88a8.line_size;
                }
                local_88a8.parse = (local_88a8.lflags << 0x19) >> 0x1f & 3;
                if ((char)(byte)local_88a8.lflags < '\0') {
                  pal_00 = local_88a8.lpal;
                  stbi__gif_parse_colortable
                            (s,pal_00,2 << ((byte)local_88a8.lflags & 7),
                             -(uint)((local_88a8.eflags & 1U) == 0) | local_88a8.transparent);
                }
                else {
                  pal_00 = local_88a8.pal;
                  if ((local_88a8.flags & 0x80U) == 0) {
                    pcVar32 = "missing color table";
                    goto LAB_00458cca;
                  }
                }
                pbVar25 = s->img_buffer;
                local_88a8.color_table = *pal_00;
                if (pbVar25 < s->img_buffer_end) {
LAB_00459130:
                  s->img_buffer = pbVar25 + 1;
                  bVar8 = *pbVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                    s->callback_already_read =
                         s->callback_already_read +
                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar23;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar27;
                      s->img_buffer_end = psVar27 + iVar10;
                    }
                    pbVar25 = s->img_buffer;
                    goto LAB_00459130;
                  }
                  bVar8 = 0;
                }
                if (bVar8 < 0xd) {
                  uVar40 = 1 << (bVar8 & 0x1f);
                  uVar34 = 0;
                  do {
                    local_88a8.codes[uVar34].prefix = -1;
                    local_88a8.codes[uVar34].first = (stbi_uc)uVar34;
                    local_88a8.codes[uVar34].suffix = (stbi_uc)uVar34;
                    uVar34 = uVar34 + 1;
                  } while (uVar40 != uVar34);
                  uVar18 = (2 << (bVar8 & 0x1f)) - 1;
                  bVar51 = true;
                  uVar48 = 0;
                  iVar15 = 0;
                  uVar30 = 0;
                  uVar11 = uVar18;
                  uVar36 = uVar40 + 2;
                  iVar10 = bVar8 + 1;
                  uVar44 = 0xffffffff;
LAB_004591d1:
                  do {
                    iVar16 = iVar15 - iVar10;
                    if (iVar10 <= iVar15) {
                      bVar28 = (byte)iVar10;
                      uVar39 = uVar30 & uVar11;
                      bVar50 = true;
                      if (uVar39 == uVar40) {
                        uVar39 = 0xffffffff;
                        iVar10 = bVar8 + 1;
                        uVar11 = uVar18;
                        uVar36 = uVar40 + 2;
                        bVar51 = false;
                      }
                      else {
                        if (uVar39 == uVar40 + 1) {
                          do {
                            stbi__skip(s,uVar48);
                            pbVar25 = s->img_buffer;
                            if (pbVar25 < s->img_buffer_end) {
LAB_004593f4:
                              s->img_buffer = pbVar25 + 1;
                              bVar9 = *pbVar25;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                                s->callback_already_read =
                                     s->callback_already_read +
                                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                                if (iVar15 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar27;
                                  s->img_buffer_end = psVar23;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar27;
                                  s->img_buffer_end = psVar27 + iVar15;
                                }
                                pbVar25 = s->img_buffer;
                                goto LAB_004593f4;
                              }
                              bVar9 = 0;
                            }
                            if (bVar9 == 0) goto LAB_0045942d;
                            uVar48 = (uint)bVar9;
                          } while( true );
                        }
                        if ((int)uVar36 < (int)uVar39) {
                          *puVar1 = "illegal code in raster";
                        }
                        else if (bVar51) {
                          *puVar1 = "no clear code";
                          bVar51 = true;
                        }
                        else {
                          if ((int)uVar44 < 0) {
                            if (uVar39 != uVar36) goto LAB_00459522;
                            *puVar1 = "illegal code in raster";
                          }
                          else {
                            uVar31 = uVar36 + 1;
                            if ((int)uVar36 < 0x2000) {
                              local_88a8.codes[(int)uVar36].prefix = (stbi__int16)uVar44;
                              sVar7 = local_88a8.codes[uVar44].first;
                              local_88a8.codes[(int)uVar36].first = sVar7;
                              if (uVar39 != uVar31) {
                                sVar7 = local_88a8.codes[(int)uVar39].first;
                              }
                              local_88a8.codes[(int)uVar36].suffix = sVar7;
                              uVar36 = uVar31;
LAB_00459522:
                              stbi__out_gif_code(&local_88a8,(stbi__uint16)uVar39);
                              bVar51 = (uVar36 & uVar11) == 0;
                              iVar15 = iVar10 + 1;
                              if ((int)uVar36 < 0x1000 && bVar51) {
                                iVar10 = iVar15;
                              }
                              if ((int)uVar36 < 0x1000 && bVar51) {
                                uVar11 = ~(-1 << ((byte)iVar15 & 0x1f));
                              }
                              bVar51 = false;
                              bVar50 = true;
                              goto LAB_00459475;
                            }
                            *puVar1 = "too many codes";
                            uVar36 = uVar31;
                          }
                          bVar51 = false;
                        }
                        bVar50 = false;
                        local_8968 = (stbi__context *)0x0;
                        uVar39 = uVar44;
                      }
                      goto LAB_00459475;
                    }
                    if (uVar48 == 0) {
                      pbVar25 = s->img_buffer;
                      if (pbVar25 < s->img_buffer_end) {
LAB_00459263:
                        s->img_buffer = pbVar25 + 1;
                        bVar28 = *pbVar25;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar16 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar27;
                            s->img_buffer_end = psVar23;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar27;
                            s->img_buffer_end = psVar27 + iVar16;
                          }
                          pbVar25 = s->img_buffer;
                          goto LAB_00459263;
                        }
                        bVar28 = 0;
                      }
                      if (bVar28 == 0) {
                        local_8968 = (stbi__context *)local_88a8.out;
                        goto LAB_0045958e;
                      }
                      uVar48 = (uint)bVar28;
                    }
                    pbVar25 = s->img_buffer;
                    if (pbVar25 < s->img_buffer_end) {
LAB_004592fb:
                      s->img_buffer = pbVar25 + 1;
                      uVar39 = (uint)*pbVar25;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar27,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar16 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar27;
                          s->img_buffer_end = psVar23;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar27;
                          s->img_buffer_end = psVar27 + iVar16;
                        }
                        pbVar25 = s->img_buffer;
                        goto LAB_004592fb;
                      }
                      uVar39 = 0;
                    }
                    bVar28 = (byte)iVar15;
                    uVar48 = uVar48 - 1;
                    iVar15 = iVar15 + 8;
                    uVar30 = uVar30 | uVar39 << (bVar28 & 0x1f);
                  } while( true );
                }
                local_8968 = (stbi__context *)0x0;
LAB_0045958e:
                if (local_8968 != (stbi__context *)0x0) {
                  pcVar32 = (char *)local_8968;
                  if ((stbi__context *)psVar21 == (stbi__context *)0x0) {
                    if (0 < local_88a8.h * local_88a8.w && 0 < local_88a8.bgindex) {
                      uVar34 = 0;
                      do {
                        if (*(char *)((long)local_88a8.history + uVar34) == '\0') {
                          local_88a8.pal[local_88a8.bgindex][3] = 0xff;
                          *(stbi_uc (*) [4])
                           ((stbi_uc *)((long)local_88a8.out + 0x38) + uVar34 * 4 + -0x38) =
                               local_88a8.pal[local_88a8.bgindex];
                        }
                        uVar34 = uVar34 + 1;
                        bVar51 = false;
                      } while ((uint)(local_88a8.h * local_88a8.w) != uVar34);
                      goto LAB_00459718;
                    }
                  }
                  bVar51 = false;
                  goto LAB_00459718;
                }
              }
              bVar51 = false;
              pcVar32 = (char *)(stbi__context *)0x0;
            }
            else {
              pcVar32 = "unknown code";
LAB_00458cca:
              *puVar1 = pcVar32;
              bVar51 = false;
              pcVar32 = (char *)(stbi__context *)0x0;
            }
LAB_00459718:
          } while (bVar51);
        }
LAB_00459924:
        psVar26 = (stbi__context *)0x0;
        if ((stbi__context *)pcVar32 != s) {
          psVar26 = (stbi__context *)pcVar32;
        }
        if (psVar26 == (stbi__context *)0x0) {
          if ((stbi__context *)local_88a8.out != (stbi__context *)0x0) {
            free(local_88a8.out);
          }
          psVar26 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
        }
        free(local_88a8.history);
        free(local_88a8.background);
        return psVar26;
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        pcVar32 = (char *)s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,pcVar32,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = (stbi_uc *)pcVar32;
          s->img_buffer_end = (stbi_uc *)pcVar32 + iVar10;
        }
        psVar21 = s->img_buffer;
        goto LAB_0045735f;
      }
LAB_00457cae:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    iVar10 = stbi__get16be(s);
    uVar11 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar11 | iVar10 << 0x10) != 0x38425053) {
      iVar10 = stbi__pic_test(s);
      if (iVar10 != 0) {
        pvVar22 = stbi__pic_load(s,x,y,comp,uVar40,ri_00);
        return pvVar22;
      }
      iVar10 = stbi__jpeg_test(s);
      if (iVar10 != 0) {
        pvVar22 = stbi__jpeg_load(s,x,y,comp,uVar40,ri_00);
        return pvVar22;
      }
      iVar10 = stbi__pnm_test(s);
      if (iVar10 != 0) {
        pvVar22 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar22;
      }
      iVar10 = stbi__hdr_test(s);
      if (iVar10 != 0) {
        data = stbi__hdr_load(s,x,y,comp,uVar40,ri_00);
        psVar21 = stbi__hdr_to_ldr(data,*x,*y,(int)comp);
        return psVar21;
      }
      iVar10 = stbi__tga_test(s);
      if (iVar10 != 0) {
        pvVar22 = stbi__tga_load(s,x,y,comp,uVar40,ri_00);
        return pvVar22;
      }
      lVar35 = *in_FS_OFFSET;
      pcVar32 = "unknown image type";
      goto LAB_00457ebc;
    }
    iVar10 = stbi__get16be(s);
    uVar40 = stbi__get16be(s);
    if ((uVar40 | iVar10 << 0x10) != 0x38425053) {
      lVar35 = *in_FS_OFFSET;
      pcVar32 = "not PSD";
      goto LAB_00457ebc;
    }
    iVar10 = stbi__get16be(s);
    if (iVar10 != 1) {
      lVar35 = *in_FS_OFFSET;
      pcVar32 = "wrong version";
      goto LAB_00457ebc;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00457def:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar10 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar10) goto LAB_00457def;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar10);
    }
    uVar40 = stbi__get16be(s);
    if (0x10 < uVar40) {
      lVar35 = *in_FS_OFFSET;
      pcVar32 = "wrong channel count";
      goto LAB_00457ebc;
    }
    iVar10 = stbi__get16be(s);
    iVar10 = iVar10 * 0x10000;
    iVar15 = stbi__get16be(s);
    iVar47 = iVar10 + iVar15;
    iVar16 = stbi__get16be(s);
    iVar17 = stbi__get16be(s);
    if (iVar47 < 0x1000001) {
      iVar16 = iVar16 * 0x10000;
      iVar29 = iVar16 + iVar17;
      if (iVar29 < 0x1000001) {
        iVar12 = stbi__get16be(s);
        if ((iVar12 != 8) && (iVar12 != 0x10)) {
          lVar35 = *in_FS_OFFSET;
          pcVar32 = "unsupported bit depth";
          goto LAB_00457ebc;
        }
        iVar13 = stbi__get16be(s);
        if (iVar13 != 3) {
          lVar35 = *in_FS_OFFSET;
          pcVar32 = "wrong color format";
          goto LAB_00457ebc;
        }
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        uVar11 = stbi__get16be(s);
        if (1 < uVar11) {
          lVar35 = *in_FS_OFFSET;
          pcVar32 = "bad compression";
          goto LAB_00457ebc;
        }
        iVar13 = stbi__mad3sizes_valid(4,iVar29,iVar47,0);
        if (iVar13 != 0) {
          if ((((int)ri == 0x10) && (iVar12 == 0x10)) && (uVar11 == 0)) {
            pvVar22 = stbi__malloc_mad3(8,iVar29,iVar47,0);
            *piVar41 = 0x10;
          }
          else {
            pvVar22 = malloc((long)(iVar47 * iVar29 * 4));
          }
          if (pvVar22 != (void *)0x0) {
            iVar13 = iVar29 * iVar47;
            if (uVar11 == 0) {
              psVar21 = s->buffer_start;
              iVar45 = (iVar15 + iVar10) * (iVar17 + iVar16);
              uVar34 = 0;
              pvVar46 = pvVar22;
              local_8978 = pvVar22;
              do {
                if (uVar34 < uVar40) {
                  if (*piVar41 == 0x10) {
                    if (0 < iVar13) {
                      lVar35 = 0;
                      do {
                        iVar19 = stbi__get16be(s);
                        *(short *)((long)pvVar46 + lVar35 * 8) = (short)iVar19;
                        lVar35 = lVar35 + 1;
                      } while (iVar45 != (int)lVar35);
                    }
                  }
                  else if (iVar12 == 0x10) {
                    if (0 < iVar13) {
                      lVar35 = 0;
                      do {
                        iVar19 = stbi__get16be(s);
                        *(char *)((long)local_8978 + lVar35 * 4) = (char)((uint)iVar19 >> 8);
                        lVar35 = lVar35 + 1;
                      } while (iVar45 != (int)lVar35);
                    }
                  }
                  else if (0 < iVar13) {
                    lVar35 = 0;
                    do {
                      psVar27 = s->img_buffer;
                      if (psVar27 < s->img_buffer_end) {
LAB_00459b50:
                        s->img_buffer = psVar27 + 1;
                        sVar7 = *psVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar19 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar19 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar21;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar21;
                            s->img_buffer_end = psVar21 + iVar19;
                          }
                          psVar27 = s->img_buffer;
                          goto LAB_00459b50;
                        }
                        sVar7 = '\0';
                      }
                      *(stbi_uc *)((long)local_8978 + lVar35 * 4) = sVar7;
                      lVar35 = lVar35 + 1;
                    } while (iVar45 != (int)lVar35);
                  }
                }
                else if (iVar12 == 0x10 && (int)ri == 0x10) {
                  if (0 < iVar13) {
                    lVar35 = 0;
                    do {
                      *(ushort *)((long)pvVar46 + lVar35 * 8) = -(ushort)(uVar34 == 3);
                      lVar35 = lVar35 + 1;
                    } while (iVar45 != (int)lVar35);
                  }
                }
                else if (0 < iVar13) {
                  lVar35 = 0;
                  do {
                    *(char *)((long)local_8978 + lVar35 * 4) = -(uVar34 == 3);
                    lVar35 = lVar35 + 1;
                  } while (iVar45 != (int)lVar35);
                }
                uVar34 = uVar34 + 1;
                local_8978 = (void *)((long)local_8978 + 1);
                pvVar46 = (void *)((long)pvVar46 + 2);
              } while (uVar34 != 4);
            }
            else {
              stbi__skip(s,uVar40 * iVar47 * 2);
              uVar34 = 0;
              pvVar46 = pvVar22;
              do {
                if (uVar34 < uVar40) {
                  iVar12 = stbi__psd_decode_rle(s,(stbi_uc *)((long)pvVar22 + uVar34),iVar13);
                  if (iVar12 == 0) {
                    free(pvVar22);
                    lVar35 = *in_FS_OFFSET;
                    pcVar32 = "corrupt";
                    goto LAB_00457ebc;
                  }
                }
                else if (0 < iVar13) {
                  lVar35 = 0;
                  do {
                    *(char *)((long)pvVar46 + lVar35 * 4) = -(uVar34 == 3);
                    lVar35 = lVar35 + 1;
                  } while ((iVar15 + iVar10) * (iVar17 + iVar16) != (int)lVar35);
                }
                uVar34 = uVar34 + 1;
                pvVar46 = (void *)((long)pvVar46 + 1);
              } while (uVar34 != 4);
            }
            if (3 < uVar40) {
              if (*piVar41 == 0x10) {
                if (0 < iVar13) {
                  uVar34 = 0;
                  do {
                    uVar3 = *(ushort *)((long)pvVar22 + uVar34 * 8 + 6);
                    if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                      fVar53 = 1.0 / ((float)uVar3 / 65535.0);
                      fVar52 = (1.0 - fVar53) * 65535.0;
                      *(short *)((long)pvVar22 + uVar34 * 8) =
                           (short)(int)((float)*(ushort *)((long)pvVar22 + uVar34 * 8) * fVar53 +
                                       fVar52);
                      *(short *)((long)pvVar22 + uVar34 * 8 + 2) =
                           (short)(int)((float)*(ushort *)((long)pvVar22 + uVar34 * 8 + 2) * fVar53
                                       + fVar52);
                      *(short *)((long)pvVar22 + uVar34 * 8 + 4) =
                           (short)(int)((float)*(ushort *)((long)pvVar22 + uVar34 * 8 + 4) * fVar53
                                       + fVar52);
                    }
                    uVar34 = uVar34 + 1;
                  } while ((uint)((iVar15 + iVar10) * (iVar17 + iVar16)) != uVar34);
                }
              }
              else if (0 < iVar13) {
                uVar34 = 0;
                do {
                  bVar8 = *(byte *)((long)pvVar22 + uVar34 * 4 + 3);
                  if ((bVar8 != 0) && (bVar8 != 0xff)) {
                    fVar53 = 1.0 / ((float)bVar8 / 255.0);
                    fVar52 = (1.0 - fVar53) * 255.0;
                    *(char *)((long)pvVar22 + uVar34 * 4) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar34 * 4) * fVar53 + fVar52)
                    ;
                    *(char *)((long)pvVar22 + uVar34 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar34 * 4 + 1) * fVar53 +
                                    fVar52);
                    *(char *)((long)pvVar22 + uVar34 * 4 + 2) =
                         (char)(int)((float)*(byte *)((long)pvVar22 + uVar34 * 4 + 2) * fVar53 +
                                    fVar52);
                  }
                  uVar34 = uVar34 + 1;
                } while ((uint)((iVar15 + iVar10) * (iVar17 + iVar16)) != uVar34);
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = iVar47;
            *x = iVar29;
            return pvVar22;
          }
          goto LAB_004598ea;
        }
      }
    }
  }
  else {
    local_88d4.all_a = 0xff;
    pvVar22 = stbi__bmp_parse_header(s,&local_88d4);
    uVar40 = local_88d4.all_a;
    if (pvVar22 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar11 = s->img_y;
    uVar36 = -uVar11;
    if (0 < (int)uVar11) {
      uVar36 = uVar11;
    }
    s->img_y = uVar36;
    if ((uVar36 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88d4.hsz == 0xc) {
        if (local_88d4.bpp < 0x18) {
          uVar36 = ((local_88d4.offset - local_88d4.extra_read) + -0x18) / 3;
        }
        else {
LAB_004573f8:
          uVar36 = 0;
        }
      }
      else {
        if (0xf < local_88d4.bpp) goto LAB_004573f8;
        uVar36 = local_88d4.offset - (local_88d4.extra_read + local_88d4.hsz) >> 2;
      }
      if (uVar36 == 0) {
        iVar10 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar10 - 0x401U < 0xfffffc00) {
          lVar35 = *in_FS_OFFSET;
          pcVar32 = "bad header";
          goto LAB_00457ebc;
        }
        if ((local_88d4.offset < iVar10) || (0x400 < local_88d4.offset - iVar10)) {
          lVar35 = *in_FS_OFFSET;
          pcVar32 = "bad offset";
          goto LAB_00457ebc;
        }
        stbi__skip(s,local_88d4.offset - iVar10);
      }
      uVar44 = local_88d4.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88d4.ma == 0 || local_88d4.bpp == 0x18 && uVar44 == 0);
      sVar14 = s->img_x;
      sVar4 = s->img_y;
      iVar10 = stbi__mad3sizes_valid(4,sVar14,sVar4,0);
      if (iVar10 != 0) {
        pvVar22 = stbi__malloc_mad3(4,sVar14,sVar4,0);
        if (pvVar22 != (void *)0x0) {
          if (local_88d4.bpp < 0x10) {
            if ((int)uVar36 < 0x101 && uVar36 != 0) {
              if (0 < (int)uVar36) {
                psVar21 = s->buffer_start;
                psVar27 = s->buffer_start + 1;
                uVar34 = 0;
                do {
                  psVar23 = s->img_buffer;
                  if (psVar23 < s->img_buffer_end) {
LAB_00457784:
                    s->img_buffer = psVar23 + 1;
                    sVar7 = *psVar23;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar27;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar21 + iVar10;
                      }
                      psVar23 = s->img_buffer;
                      goto LAB_00457784;
                    }
                    sVar7 = '\0';
                  }
                  local_88a8.pal[uVar34 - 0xd][2] = sVar7;
                  psVar23 = s->img_buffer;
                  if (psVar23 < s->img_buffer_end) {
LAB_00457818:
                    s->img_buffer = psVar23 + 1;
                    sVar7 = *psVar23;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar27;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar21 + iVar10;
                      }
                      psVar23 = s->img_buffer;
                      goto LAB_00457818;
                    }
                    sVar7 = '\0';
                  }
                  local_88a8.pal[uVar34 - 0xd][1] = sVar7;
                  psVar23 = s->img_buffer;
                  if (psVar23 < s->img_buffer_end) {
LAB_004578ac:
                    s->img_buffer = psVar23 + 1;
                    sVar7 = *psVar23;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar27;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar21 + iVar10;
                      }
                      psVar23 = s->img_buffer;
                      goto LAB_004578ac;
                    }
                    sVar7 = '\0';
                  }
                  local_88a8.pal[uVar34 - 0xd][0] = sVar7;
                  if (local_88d4.hsz != 0xc) {
                    psVar23 = s->img_buffer;
                    if (s->img_buffer_end <= psVar23) {
                      if (s->read_from_callbacks == 0) goto LAB_00457951;
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                      s->callback_already_read =
                           s->callback_already_read +
                           (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar27;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar21;
                        s->img_buffer_end = psVar21 + iVar10;
                      }
                      psVar23 = s->img_buffer;
                    }
                    s->img_buffer = psVar23 + 1;
                  }
LAB_00457951:
                  local_88a8.pal[uVar34 - 0xd][3] = 0xff;
                  uVar34 = uVar34 + 1;
                } while (uVar36 != uVar34);
              }
              stbi__skip(s,(uVar36 * (local_88d4.hsz == 0xc | 0xfffffffc) + local_88d4.offset) -
                           (local_88d4.hsz + local_88d4.extra_read));
              if (local_88d4.bpp == 8) {
                uVar36 = s->img_x;
              }
              else if (local_88d4.bpp == 4) {
                uVar36 = s->img_x + 1 >> 1;
              }
              else {
                if (local_88d4.bpp != 1) {
                  free(pvVar22);
                  lVar35 = *in_FS_OFFSET;
                  pcVar32 = "bad bpp";
                  goto LAB_00457ebc;
                }
                uVar36 = s->img_x + 7 >> 3;
              }
              if (local_88d4.bpp == 1) {
                if (0 < (int)s->img_y) {
                  psVar21 = s->buffer_start;
                  lVar35 = 0;
                  iVar10 = 0;
                  do {
                    pbVar25 = s->img_buffer;
                    if (pbVar25 < s->img_buffer_end) {
LAB_0045814c:
                      s->img_buffer = pbVar25 + 1;
                      uVar44 = (uint)*pbVar25;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar21;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar21 + iVar15;
                        }
                        pbVar25 = s->img_buffer;
                        goto LAB_0045814c;
                      }
                      uVar44 = 0;
                    }
                    lVar35 = (long)(int)lVar35;
                    uVar30 = 7;
                    sVar14 = 1;
                    do {
                      sVar4 = s->img_x;
                      if ((int)sVar4 <= (int)(sVar14 - 1)) break;
                      uVar34 = (ulong)((uVar44 >> (uVar30 & 0x1f) & 1) != 0);
                      *(stbi_uc *)((long)pvVar22 + lVar35) = local_88a8.pal[uVar34 - 0xd][0];
                      *(stbi_uc *)((long)pvVar22 + lVar35 + 1U) = local_88a8.pal[uVar34 - 0xd][1];
                      *(stbi_uc *)((long)pvVar22 + lVar35 + 2U) = local_88a8.pal[uVar34 - 0xd][2];
                      *(undefined1 *)((long)pvVar22 + lVar35 + 3U) = 0xff;
                      if (sVar14 != sVar4) {
                        if ((int)uVar30 < 1) {
                          pbVar25 = s->img_buffer;
                          if (pbVar25 < s->img_buffer_end) {
LAB_0045824f:
                            s->img_buffer = pbVar25 + 1;
                            uVar44 = (uint)*pbVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                              s->callback_already_read =
                                   s->callback_already_read +
                                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                              if (iVar15 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar21;
                                s->img_buffer_end = s->buffer_start + 1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar21;
                                s->img_buffer_end = psVar21 + iVar15;
                              }
                              pbVar25 = s->img_buffer;
                              goto LAB_0045824f;
                            }
                            uVar44 = 0;
                          }
                          uVar30 = 7;
                        }
                        else {
                          uVar30 = uVar30 - 1;
                        }
                      }
                      lVar35 = lVar35 + 4;
                      bVar51 = sVar14 != sVar4;
                      sVar14 = sVar14 + 1;
                    } while (bVar51);
                    stbi__skip(s,-uVar36 & 3);
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < (int)s->img_y);
                }
              }
              else if (0 < (int)s->img_y) {
                psVar21 = s->buffer_start;
                uVar34 = 0;
                iVar10 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    iVar15 = 0;
                    do {
                      pbVar25 = s->img_buffer;
                      if (pbVar25 < s->img_buffer_end) {
LAB_00458365:
                        s->img_buffer = pbVar25 + 1;
                        uVar44 = (uint)*pbVar25;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar16 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar21;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar21;
                            s->img_buffer_end = psVar21 + iVar16;
                          }
                          pbVar25 = s->img_buffer;
                          goto LAB_00458365;
                        }
                        uVar44 = 0;
                      }
                      uVar30 = uVar44 >> 4;
                      if (local_88d4.bpp != 4) {
                        uVar30 = uVar44;
                      }
                      uVar33 = (ulong)uVar30;
                      iVar16 = (int)uVar34;
                      lVar35 = (long)iVar16;
                      *(stbi_uc *)((long)pvVar22 + lVar35) = local_88a8.pal[uVar33 - 0xd][0];
                      *(stbi_uc *)((long)pvVar22 + lVar35 + 1U) = local_88a8.pal[uVar33 - 0xd][1];
                      *(stbi_uc *)((long)pvVar22 + lVar35 + 2U) = local_88a8.pal[uVar33 - 0xd][2];
                      uVar34 = lVar35 + 4;
                      *(undefined1 *)((long)pvVar22 + lVar35 + 3U) = 0xff;
                      sVar14 = s->img_x;
                      if (iVar15 + 1U != sVar14) {
                        uVar44 = uVar44 & 0xf;
                        if (local_88d4.bpp != 4) {
                          uVar44 = 0;
                        }
                        if (local_88d4.bpp == 8) {
                          pbVar25 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar25) {
                            if (s->read_from_callbacks == 0) {
                              uVar44 = 0;
                              goto LAB_00458485;
                            }
                            iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                            s->callback_already_read =
                                 s->callback_already_read +
                                 (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                            if (iVar17 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar21;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar21;
                              s->img_buffer_end = psVar21 + iVar17;
                            }
                            pbVar25 = s->img_buffer;
                          }
                          s->img_buffer = pbVar25 + 1;
                          uVar44 = (uint)*pbVar25;
                        }
LAB_00458485:
                        uVar34 = (ulong)uVar44;
                        *(stbi_uc *)((long)pvVar22 + lVar35 + 4U) = local_88a8.pal[uVar34 - 0xd][0];
                        *(stbi_uc *)((long)pvVar22 + lVar35 + 5U) = local_88a8.pal[uVar34 - 0xd][1];
                        *(stbi_uc *)((long)pvVar22 + lVar35 + 6U) = local_88a8.pal[uVar34 - 0xd][2];
                        *(undefined1 *)((long)pvVar22 + lVar35 + 7U) = 0xff;
                        uVar34 = (ulong)(iVar16 + 8);
                      }
                    } while ((iVar15 + 1U != sVar14) &&
                            (iVar15 = iVar15 + 2, iVar15 < (int)s->img_x));
                  }
                  stbi__skip(s,-uVar36 & 3);
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)s->img_y);
              }
              goto LAB_00458913;
            }
            free(pvVar22);
            lVar35 = *in_FS_OFFSET;
            pcVar32 = "invalid";
            goto LAB_00457ebc;
          }
          stbi__skip(s,local_88d4.offset - (local_88d4.hsz + local_88d4.extra_read));
          if (local_88d4.bpp == 0x18) {
            iVar10 = -3;
LAB_00457a83:
            uVar36 = iVar10 * s->img_x & 3;
          }
          else {
            uVar36 = 0;
            if (local_88d4.bpp == 0x10) {
              iVar10 = -2;
              goto LAB_00457a83;
            }
          }
          if (local_88d4.bpp == 0x18) {
            bVar51 = false;
LAB_00457ac4:
            bVar50 = false;
          }
          else {
            if (local_88d4.bpp != 0x20) {
              bVar51 = true;
              goto LAB_00457ac4;
            }
            bVar50 = (local_88d4.mr == 0xff0000 &&
                     (local_88d4.mg == 0xff00 && local_88d4.mb == 0xff)) && uVar44 == 0;
            bVar51 = (local_88d4.mr != 0xff0000 ||
                     (local_88d4.mg != 0xff00 || local_88d4.mb != 0xff)) || uVar44 != 0;
          }
          iVar17 = 0;
          iVar10 = 0;
          iVar15 = 0;
          iVar16 = 0;
          local_8990 = 0;
          uVar44 = 0;
          uVar30 = 0;
          uVar18 = 0;
          if (bVar51) {
            if (local_88d4.mb != 0 && (local_88d4.mg != 0 && local_88d4.mr != 0)) {
              iVar17 = stbi__high_bit(local_88d4.mr);
              local_8990 = stbi__bitcount(local_88d4.mr);
              iVar10 = stbi__high_bit(local_88d4.mg);
              uVar44 = stbi__bitcount(local_88d4.mg);
              iVar15 = stbi__high_bit(local_88d4.mb);
              uVar30 = stbi__bitcount(local_88d4.mb);
              iVar16 = stbi__high_bit(local_88d4.ma);
              uVar18 = stbi__bitcount(local_88d4.ma);
              if ((uVar18 < 9 && uVar30 < 9) && (uVar44 < 9 && local_8990 < 9)) {
                iVar17 = iVar17 + -7;
                iVar10 = iVar10 + -7;
                iVar15 = iVar15 + -7;
                iVar16 = iVar16 + -7;
                goto LAB_00458524;
              }
            }
            free(pvVar22);
            *(char **)(*in_FS_OFFSET + -8) = "bad masks";
            bVar5 = false;
          }
          else {
LAB_00458524:
            bVar5 = true;
            if (0 < (int)s->img_y) {
              psVar21 = s->buffer_start;
              psVar27 = s->buffer_start + 1;
              local_88b0 = (long)pvVar22 + 3;
              iVar29 = 0;
              iVar47 = 0;
              do {
                lVar35 = local_88b0;
                iVar12 = iVar29;
                if (bVar51) {
                  if (0 < (int)s->img_x) {
                    lVar37 = 0;
                    do {
                      uVar48 = stbi__get16le(s);
                      if (local_88d4.bpp != 0x10) {
                        iVar13 = stbi__get16le(s);
                        uVar48 = uVar48 | iVar13 << 0x10;
                      }
                      iVar13 = stbi__shiftsigned(uVar48 & local_88d4.mr,iVar17,local_8990);
                      *(char *)(lVar35 + lVar37 * 4 + (long)iVar29 + -3) = (char)iVar13;
                      iVar13 = stbi__shiftsigned(uVar48 & local_88d4.mg,iVar10,uVar44);
                      *(char *)(lVar35 + lVar37 * 4 + (long)iVar29 + -2) = (char)iVar13;
                      iVar13 = stbi__shiftsigned(uVar48 & local_88d4.mb,iVar15,uVar30);
                      *(char *)(lVar35 + lVar37 * 4 + (long)iVar29 + -1) = (char)iVar13;
                      if (local_88d4.ma == 0) {
                        uVar48 = 0xff;
                      }
                      else {
                        uVar48 = stbi__shiftsigned(uVar48 & local_88d4.ma,iVar16,uVar18);
                      }
                      uVar40 = uVar40 | uVar48;
                      *(char *)(lVar35 + lVar37 * 4 + (long)iVar29) = (char)uVar48;
                      iVar12 = iVar12 + 4;
                      lVar37 = lVar37 + 1;
                    } while ((int)lVar37 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  lVar37 = 0;
                  do {
                    psVar23 = s->img_buffer;
                    if (psVar23 < s->img_buffer_end) {
LAB_004586e8:
                      s->img_buffer = psVar23 + 1;
                      sVar7 = *psVar23;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar27;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar21 + iVar13;
                        }
                        psVar23 = s->img_buffer;
                        goto LAB_004586e8;
                      }
                      sVar7 = '\0';
                    }
                    *(stbi_uc *)(lVar35 + lVar37 * 4 + (long)iVar29 + -1) = sVar7;
                    psVar23 = s->img_buffer;
                    if (psVar23 < s->img_buffer_end) {
LAB_0045877c:
                      s->img_buffer = psVar23 + 1;
                      sVar7 = *psVar23;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar27;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar21 + iVar13;
                        }
                        psVar23 = s->img_buffer;
                        goto LAB_0045877c;
                      }
                      sVar7 = '\0';
                    }
                    *(stbi_uc *)(lVar35 + lVar37 * 4 + (long)iVar29 + -2) = sVar7;
                    psVar23 = s->img_buffer;
                    if (psVar23 < s->img_buffer_end) {
LAB_00458810:
                      s->img_buffer = psVar23 + 1;
                      sVar7 = *psVar23;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar27;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar21 + iVar13;
                        }
                        psVar23 = s->img_buffer;
                        goto LAB_00458810;
                      }
                      sVar7 = '\0';
                    }
                    *(stbi_uc *)(lVar35 + lVar37 * 4 + (long)iVar29 + -3) = sVar7;
                    bVar8 = 0xff;
                    if (bVar50) {
                      pbVar25 = s->img_buffer;
                      if (s->img_buffer_end <= pbVar25) {
                        if (s->read_from_callbacks == 0) {
                          bVar8 = 0;
                          goto LAB_004588be;
                        }
                        iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar21,s->buflen);
                        s->callback_already_read =
                             s->callback_already_read +
                             (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                        if (iVar13 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar27;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar21;
                          s->img_buffer_end = psVar21 + iVar13;
                        }
                        pbVar25 = s->img_buffer;
                      }
                      s->img_buffer = pbVar25 + 1;
                      bVar8 = *pbVar25;
                    }
LAB_004588be:
                    uVar40 = uVar40 | bVar8;
                    *(byte *)(lVar35 + lVar37 * 4 + (long)iVar29) = bVar8;
                    iVar12 = iVar12 + 4;
                    lVar37 = lVar37 + 1;
                  } while ((int)lVar37 < (int)s->img_x);
                }
                iVar29 = iVar12;
                stbi__skip(s,uVar36);
                iVar47 = iVar47 + 1;
              } while (iVar47 < (int)s->img_y);
              bVar5 = true;
            }
          }
          if (!bVar5) {
            return (void *)0x0;
          }
LAB_00458913:
          if ((uVar40 == 0) && (iVar10 = s->img_x * s->img_y * 4, -1 < iVar10 + -1)) {
            lVar35 = (ulong)(iVar10 - 4) + 7;
            do {
              *(undefined1 *)((long)pvVar22 + lVar35 + 0xfffffffffffffffcU) = 0xff;
              lVar35 = lVar35 + -4;
            } while (3 < lVar35);
          }
          if (0 < (int)uVar11) {
            uVar40 = (int)s->img_y >> 1;
            if (0 < (int)uVar40) {
              sVar14 = s->img_x;
              uVar11 = sVar14 * 4;
              uVar34 = 1;
              if (1 < (int)uVar11) {
                uVar34 = (ulong)uVar11;
              }
              uVar36 = (s->img_y - 1) * sVar14 * 4;
              uVar33 = 0;
              uVar43 = 0;
              do {
                if (0 < (int)sVar14) {
                  uVar38 = 0;
                  do {
                    uVar2 = *(undefined1 *)((long)pvVar22 + uVar38 + uVar33);
                    *(undefined1 *)((long)pvVar22 + uVar38 + uVar33) =
                         *(undefined1 *)((long)pvVar22 + uVar38 + uVar36);
                    *(undefined1 *)((long)pvVar22 + uVar38 + uVar36) = uVar2;
                    uVar38 = uVar38 + 1;
                  } while (uVar34 != uVar38);
                }
                uVar43 = uVar43 + 1;
                uVar36 = uVar36 + sVar14 * -4;
                uVar33 = (ulong)((int)uVar33 + uVar11);
              } while (uVar43 != uVar40);
            }
          }
          *x = s->img_x;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return pvVar22;
          }
          return pvVar22;
        }
LAB_004598ea:
        lVar35 = *in_FS_OFFSET;
        pcVar32 = "outofmem";
        goto LAB_00457ebc;
      }
    }
  }
  lVar35 = *in_FS_OFFSET;
  pcVar32 = "too large";
LAB_00457ebc:
  *(char **)(lVar35 + -8) = pcVar32;
  return (void *)0x0;
LAB_0045942d:
  uVar48 = 0;
  local_8968 = (stbi__context *)local_88a8.out;
  bVar50 = false;
  uVar39 = uVar44;
LAB_00459475:
  iVar15 = iVar16;
  uVar30 = (int)uVar30 >> (bVar28 & 0x1f);
  uVar44 = uVar39;
  if (!bVar50) goto LAB_0045958e;
  goto LAB_004591d1;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}